

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order.cpp
# Opt level: O1

void __thiscall
haVoc::Movehistory::update
          (Movehistory *this,position *p,Move *m,Move *previous,int16 *depth,Score *eval,
          vector<Move,_std::allocator<Move>_> *quiets,Move *killers)

{
  int *piVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  U8 UVar6;
  Color CVar7;
  pointer pMVar8;
  pointer pMVar9;
  int iVar10;
  
  if (m->type == '\n') {
    iVar10 = (int)*depth * (int)*depth;
    CVar7 = (p->ifo).stm;
    bVar2 = m->f;
    bVar3 = m->t;
    piVar1 = (this->history)._M_elems[CVar7]._M_elems[bVar2]._M_elems + bVar3;
    *piVar1 = *piVar1 + iVar10;
    bVar4 = previous->f;
    bVar5 = previous->t;
    (&(this->counters)._M_elems[0]._M_elems[bVar5].f)[(uint)bVar4 * 0xc0] = bVar2;
    (&(this->counters)._M_elems[0]._M_elems[bVar5].t)[(uint)bVar4 * 0xc0] = bVar3;
    (&(this->counters)._M_elems[0]._M_elems[bVar5].type)[(uint)bVar4 * 0xc0] = '\n';
    if (((*eval < mate_max_ply) &&
        (((UVar6 = m->f, UVar6 != killers[2].f || (m->t != killers[2].t)) ||
         (m->type != killers[2].type)))) &&
       ((((UVar6 != killers[3].f || (m->t != killers[3].t)) || (m->type != killers[3].type)) &&
        (((UVar6 != killers->f || (m->t != killers->t)) || (m->type != killers->type)))))) {
      killers[1].f = killers->f;
      UVar6 = killers->type;
      killers[1].t = killers->t;
      killers[1].type = UVar6;
      killers->f = m->f;
      killers->t = m->t;
      killers->type = m->type;
    }
    pMVar9 = (quiets->super__Vector_base<Move,_std::allocator<Move>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pMVar8 = (quiets->super__Vector_base<Move,_std::allocator<Move>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pMVar9 != pMVar8) {
      bVar2 = m->f;
      do {
        if (bVar2 != pMVar9->f) {
          piVar1 = (this->history)._M_elems[CVar7]._M_elems[pMVar9->f]._M_elems + pMVar9->t;
          *piVar1 = *piVar1 - iVar10;
        }
        pMVar9 = pMVar9 + 1;
      } while (pMVar9 != pMVar8);
    }
  }
  if (((~mated_max_ply < *eval) &&
      (((UVar6 = m->f, UVar6 != killers->f || (m->t != killers->t)) || (m->type != killers->type))))
     && ((((UVar6 != killers[1].f || (m->t != killers[1].t)) || (m->type != killers[1].type)) &&
         (((UVar6 != killers[2].f || (m->t != killers[2].t)) || (m->type != killers[2].type)))))) {
    killers[3].f = killers[2].f;
    UVar6 = killers[2].type;
    killers[3].t = killers[2].t;
    killers[3].type = UVar6;
    killers[2].f = m->f;
    killers[2].t = m->t;
    killers[2].type = m->type;
  }
  return;
}

Assistant:

void Movehistory::update(const position& p,
		const Move& m,
		const Move& previous,
		const int16& depth,
		const Score& eval,
		const std::vector<Move>& quiets,
		Move* killers) {

		const Color c = p.to_move();
		int score = pow(depth, 2);
		if (m.type == Movetype::quiet) {
			history[c][m.f][m.t] += score;
			counters[previous.f][previous.t] = m;
			if (eval < Score::mate_max_ply &&
				m != killers[2] &&
				m != killers[3] &&
				m != killers[0]) {
				killers[1] = killers[0];
				killers[0] = m;
			}
			for (auto& q : quiets) {
				if (m.f == q.f) continue;
				history[c][q.f][q.t] -= score;
			}
		}

		// mate killers
		if (eval >= Score::mate_max_ply &&
			m != killers[0] &&
			m != killers[1] &&
			m != killers[2]) {
			killers[3] = killers[2];
			killers[2] = m;
		}
	}